

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlChar * xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt,int qualified)

{
  bool bVar1;
  uint val;
  int iVar2;
  int iVar3;
  uint uVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  long lVar7;
  uint len;
  int l;
  xmlChar buf [105];
  int local_bc;
  ulong local_b8;
  int local_ac;
  xmlChar local_a8 [120];
  
  val = xmlXPathCurrentChar(ctxt,&local_bc);
  if ((val - 0x20 < 0x3e) && ((0x2800000140008401U >> ((ulong)(val - 0x20) & 0x3f) & 1) != 0)) {
    return (xmlChar *)0x0;
  }
  if (val < 0x100) {
    if ((val - 0xc0 < 0x17 || (val & 0xdf) - 0x41 < 0x1a) || (0xf7 < val || val - 0xd8 < 0x1f))
    goto LAB_001dff72;
  }
  else {
    iVar2 = xmlCharInRange(val,&xmlIsBaseCharGroup);
    if (iVar2 != 0) goto LAB_001dff72;
  }
  if (val < 0x100) {
    if (val == 0x5f) goto LAB_001dff72;
  }
  else if ((0xfffffff6 < val - 0x302a || 0xffffae59 < val - 0x9fa6) || val == 0x3007)
  goto LAB_001dff72;
  if (val != 0x3a || qualified == 0) {
    return (xmlChar *)0x0;
  }
LAB_001dff72:
  len = 0;
  local_ac = qualified;
  do {
    if ((val < 0x3f) && ((0x4000800100000000U >> ((ulong)val & 0x3f) & 1) != 0)) goto LAB_001e010c;
    if (val < 0x100) {
      if ((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) && (val < 0xf8 && 0x1e < val - 0xd8)) {
LAB_001dfffa:
        if (val < 0x100) {
          if (9 < val - 0x30) {
LAB_001e004d:
            if (((0x32 < val - 0x2d) ||
                ((0x4000000000003U >> ((ulong)(val - 0x2d) & 0x3f) & 1) == 0)) &&
               (local_ac == 0 || val != 0x3a)) {
              if (val < 0x100) {
                uVar4 = (uint)(val == 0xb7);
              }
              else {
                iVar2 = xmlCharInRange(val,&xmlIsCombiningGroup);
                if (iVar2 != 0) goto LAB_001e0066;
                uVar4 = xmlCharInRange(val,&xmlIsExtenderGroup);
              }
              if (uVar4 == 0) {
LAB_001e010c:
                if (len == 0) {
                  return (xmlChar *)0x0;
                }
                pxVar5 = xmlStrndup(local_a8,len);
                return pxVar5;
              }
            }
          }
        }
        else if (((8 < val - 0x3021 && 0x51a5 < val - 0x4e00) && val != 0x3007) &&
                (iVar2 = xmlCharInRange(val,&xmlIsDigitGroup), iVar2 == 0)) goto LAB_001e004d;
      }
    }
    else {
      iVar2 = xmlCharInRange(val,&xmlIsBaseCharGroup);
      if (iVar2 == 0) goto LAB_001dfffa;
    }
LAB_001e0066:
    lVar7 = (long)local_bc;
    if (lVar7 == 1) {
      local_a8[(int)len] = (xmlChar)val;
      len = len + 1;
    }
    else {
      iVar2 = xmlCopyChar(local_bc,local_a8 + (int)len,val);
      len = len + iVar2;
    }
    ctxt->cur = ctxt->cur + lVar7;
    val = xmlXPathCurrentChar(ctxt,&local_bc);
  } while ((int)len < 100);
  if ((int)len < 0xc351) {
    local_b8 = (ulong)(len * 2);
    pxVar5 = (xmlChar *)(*xmlMallocAtomic)((ulong)(len * 2));
    if (pxVar5 != (xmlChar *)0x0) {
      memcpy(pxVar5,local_a8,(ulong)len);
      do {
        if (val < 0x100) {
          iVar2 = (int)local_b8;
          if ((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) && (val < 0xf8 && 0x1e < val - 0xd8)
             ) {
LAB_001e023f:
            if (val < 0x100) {
              if (9 < val - 0x30) {
LAB_001e0297:
                if (((0x32 < val - 0x2d) ||
                    ((0x4000000000003U >> ((ulong)(val - 0x2d) & 0x3f) & 1) == 0)) &&
                   (local_ac == 0 || val != 0x3a)) {
                  if (val < 0x100) {
                    uVar4 = (uint)(val == 0xb7);
                  }
                  else {
                    iVar3 = xmlCharInRange(val,&xmlIsCombiningGroup);
                    iVar2 = (int)local_b8;
                    if (iVar3 != 0) goto LAB_001e02b8;
                    uVar4 = xmlCharInRange(val,&xmlIsExtenderGroup);
                    iVar2 = (int)local_b8;
                  }
                  if (uVar4 == 0) {
                    pxVar5[(int)len] = '\0';
                    return pxVar5;
                  }
                }
              }
            }
            else if ((8 < val - 0x3021 && 0x51a5 < val - 0x4e00) && val != 0x3007) {
              iVar3 = xmlCharInRange(val,&xmlIsDigitGroup);
              iVar2 = (int)local_b8;
              if (iVar3 == 0) goto LAB_001e0297;
            }
          }
        }
        else {
          iVar3 = xmlCharInRange(val,&xmlIsBaseCharGroup);
          iVar2 = (int)local_b8;
          if (iVar3 == 0) goto LAB_001e023f;
        }
LAB_001e02b8:
        if (iVar2 < (int)(len + 10)) {
          iVar3 = 7;
          if (iVar2 < 0xc351) {
            local_b8 = (ulong)(uint)(iVar2 * 2);
            pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar5,local_b8);
            if (pxVar6 == (xmlChar *)0x0) {
              iVar3 = 0xf;
              goto LAB_001e02f1;
            }
            bVar1 = true;
            pxVar5 = pxVar6;
          }
          else {
LAB_001e02f1:
            (*xmlFree)(pxVar5);
            xmlXPathErr(ctxt,iVar3);
            bVar1 = false;
          }
          if (!bVar1) {
            return (xmlChar *)0x0;
          }
        }
        if (local_bc == 1) {
          lVar7 = (long)(int)len;
          len = len + 1;
          pxVar5[lVar7] = (xmlChar)val;
        }
        else {
          iVar2 = xmlCopyChar(local_bc,pxVar5 + (int)len,val);
          len = iVar2 + len;
        }
        ctxt->cur = ctxt->cur + local_bc;
        val = xmlXPathCurrentChar(ctxt,&local_bc);
      } while( true );
    }
    iVar2 = 0xf;
  }
  else {
    iVar2 = 7;
  }
  xmlXPathErr(ctxt,iVar2);
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt, int qualified) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0, l;
    int c;

    /*
     * Handler for more complex cases
     */
    c = CUR_CHAR(l);
    if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
        (c == '[') || (c == ']') || (c == '@') || /* accelerators */
        (c == '*') || /* accelerators */
	(!IS_LETTER(c) && (c != '_') &&
         ((!qualified) || (c != ':')))) {
	return(NULL);
    }

    while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	   ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || ((qualified) && (c == ':')) ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))) {
	COPY_BUF(l,buf,len,c);
	NEXTL(l);
	c = CUR_CHAR(l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

            if (len > XML_MAX_NAME_LENGTH) {
                XP_ERRORNULL(XPATH_EXPR_ERROR);
            }
	    buffer = (xmlChar *) xmlMallocAtomic(max);
	    if (buffer == NULL) {
		XP_ERRORNULL(XPATH_MEMORY_ERROR);
	    }
	    memcpy(buffer, buf, len);
	    while ((IS_LETTER(c)) || (IS_DIGIT(c)) || /* test bigname.xml */
		   (c == '.') || (c == '-') ||
		   (c == '_') || ((qualified) && (c == ':')) ||
		   (IS_COMBINING(c)) ||
		   (IS_EXTENDER(c))) {
		if (len + 10 > max) {
                    xmlChar *tmp;
                    if (max > XML_MAX_NAME_LENGTH) {
                        xmlFree(buffer);
                        XP_ERRORNULL(XPATH_EXPR_ERROR);
                    }
		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer, max);
		    if (tmp == NULL) {
                        xmlFree(buffer);
			XP_ERRORNULL(XPATH_MEMORY_ERROR);
		    }
                    buffer = tmp;
		}
		COPY_BUF(l,buffer,len,c);
		NEXTL(l);
		c = CUR_CHAR(l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
	return(NULL);
    return(xmlStrndup(buf, len));
}